

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

int float128_eq_x86_64(float128 a,float128 b,float_status *status)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  
  uVar3 = a.high;
  uVar4 = a.low;
  uVar2 = b.high;
  if ((((~uVar3 & 0x7fff000000000000) != 0) ||
      (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
       uVar4 == 0)) &&
     (((~uVar2 & 0x7fff000000000000) != 0 ||
      (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
       b.low == 0)))) {
    iVar1 = 0;
    if (((uVar4 == b.low) && (iVar1 = 1, uVar3 != uVar2)) && (iVar1 = 0, uVar4 == 0)) {
      return (int)(((uVar2 | uVar3) & 0x7fffffffffffffff) == 0);
    }
    return iVar1;
  }
  status->float_exception_flags = status->float_exception_flags | 1;
  return 0;
}

Assistant:

int float128_eq(float128 a, float128 b, float_status *status)
{

    if (    (    ( extractFloat128Exp( a ) == 0x7FFF )
              && ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) ) )
         || (    ( extractFloat128Exp( b ) == 0x7FFF )
              && ( extractFloat128Frac0( b ) | extractFloat128Frac1( b ) ) )
       ) {
        float_raise(float_flag_invalid, status);
        return 0;
    }
    return
           ( a.low == b.low )
        && (    ( a.high == b.high )
             || (    ( a.low == 0 )
                  && ( (uint64_t) ( ( a.high | b.high )<<1 ) == 0 ) )
           );

}